

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M7Getter.cpp
# Opt level: O2

bool __thiscall ComputeM7::Write(ComputeM7 *this,FILE *F_out,char *date,char *version)

{
  pointer pp_Var1;
  _st_m7_algo_count_t *p_Var2;
  bool bVar3;
  int iVar4;
  int iVar5;
  size_t j;
  ulong uVar6;
  
  iVar4 = fprintf((FILE *)F_out,"M7.1,%s,%s, , %6f,\n",this->m71);
  iVar5 = fprintf((FILE *)F_out,"M7.2,%s,%s, , %6f,\n",this->m72,date,version);
  bVar3 = 0 < iVar5 && 0 < iVar4;
  for (uVar6 = 0;
      (bVar3 != false &&
      (pp_Var1 = (this->m7Getter).algo_count.
                 super__Vector_base<_st_m7_algo_count_t_*,_std::allocator<_st_m7_algo_count_t_*>_>.
                 _M_impl.super__Vector_impl_data._M_start,
      uVar6 < (ulong)((long)(this->m7Getter).algo_count.
                            super__Vector_base<_st_m7_algo_count_t_*,_std::allocator<_st_m7_algo_count_t_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pp_Var1 >> 3)));
      uVar6 = uVar6 + 1) {
    p_Var2 = pp_Var1[uVar6];
    iVar4 = fprintf((FILE *)F_out,"M7.3,%s,%s, %u, %6f,\n",
                    p_Var2->algo_frequency / (double)(this->m7Getter).nb_tld_queried,date,version,
                    (ulong)p_Var2->algo_code);
    bVar3 = 0 < iVar4;
  }
  for (uVar6 = 0;
      (bVar3 != false &&
      (pp_Var1 = (this->m7Getter).algo_count.
                 super__Vector_base<_st_m7_algo_count_t_*,_std::allocator<_st_m7_algo_count_t_*>_>.
                 _M_impl.super__Vector_impl_data._M_start,
      uVar6 < (ulong)((long)(this->m7Getter).algo_count.
                            super__Vector_base<_st_m7_algo_count_t_*,_std::allocator<_st_m7_algo_count_t_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pp_Var1 >> 3)));
      uVar6 = uVar6 + 1) {
    p_Var2 = pp_Var1[uVar6];
    iVar4 = fprintf((FILE *)F_out,"M7.4,%s,%s, %u, %6f,\n",
                    p_Var2->algo_frequency_cc / (double)(this->m7Getter).nb_cc_tld_queried,date,
                    version,(ulong)p_Var2->algo_code);
    bVar3 = 0 < iVar4;
  }
  return bVar3;
}

Assistant:

bool ComputeM7::Write(FILE * F_out, char const* date, char const* version)
{
    bool ret = true;

    ret = (fprintf(F_out, "M7.1,%s,%s, , %6f,\n", date, version, m71) > 0);
    ret &= (fprintf(F_out, "M7.2,%s,%s, , %6f,\n", date, version, m72) > 0);

    for (size_t j = 0; ret && j < m7Getter.algo_count.size(); j++) {
        double frequency = m7Getter.algo_count[j]->algo_frequency / ((double)m7Getter.nb_tld_queried);
        ret &= (fprintf(F_out, "M7.3,%s,%s, %u, %6f,\n", date, version, 
            m7Getter.algo_count[j]->algo_code, frequency) > 0);
    }

    for (size_t j = 0; ret && j < m7Getter.algo_count.size(); j++) {
        double frequency = m7Getter.algo_count[j]->algo_frequency_cc / ((double)m7Getter.nb_cc_tld_queried);
        ret &= (fprintf(F_out, "M7.4,%s,%s, %u, %6f,\n", date, version, 
            m7Getter.algo_count[j]->algo_code, frequency) > 0);
    }

    return ret;
}